

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLParserTest_parseFloatHexaLiteralTest_Test::TestBody
          (OpenDDLParserTest_parseFloatHexaLiteralTest_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_R9;
  float actual;
  AssertionResult gtest_ar_;
  Value *data;
  AssertionResult gtest_ar;
  char token1 [11];
  AssertHelper local_70;
  AssertHelper local_68;
  Message local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Value *local_50;
  string local_48;
  char local_28 [16];
  
  builtin_strncpy(local_28,"0x3F800000",0xb);
  sVar2 = strlen(local_28);
  local_50 = (Value *)0x0;
  pcVar3 = OpenDDLParser::parseHexaLiteral(local_28,local_28 + sVar2,&local_50);
  local_60.ss_.ptr_._0_1_ = (internal)(pcVar3 != (char *)0x0);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pcVar3 == (char *)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&local_60,(AssertionResult *)"nullptr == in","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x22a,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                       (char)local_48._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
        &local_48.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p),
                      local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    actual = Value::getFloat(local_50);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&local_48,"1.0f","value",1.0,actual);
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_60);
      if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_48._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x22c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_70,&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (CONCAT71(local_60.ss_.ptr_._1_7_,local_60.ss_.ptr_._0_1_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT71(local_60.ss_.ptr_._1_7_,local_60.ss_.ptr_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_60.ss_.ptr_._1_7_,local_60.ss_.ptr_._0_1_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_48._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    OpenDDLParserTest::registerValueForDeletion(&this->super_OpenDDLParserTest,local_50);
  }
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseFloatHexaLiteralTest) {
    size_t len(0);
    char token1[] = "0x3F800000", *end(findEnd(token1, len));
    Value *data(nullptr);
    char *in = OpenDDLParser::parseHexaLiteral(token1, end, &data);
    ASSERT_FALSE(nullptr == in);
    const float value(data->getFloat());
    EXPECT_FLOAT_EQ(1.0f, value);
    registerValueForDeletion(data);
}